

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O2

int ldesdecode(lua_State *L)

{
  int iVar1;
  uint32_t *puVar2;
  char *pcVar3;
  uint8_t *s;
  long lVar4;
  ulong uVar5;
  size_t textsz;
  uint32_t SK [32];
  uint32_t ESK [32];
  uint8_t tmp [256];
  
  des_key(L,ESK);
  puVar2 = ESK + 0x1e;
  for (uVar5 = 0; uVar5 < 0x20; uVar5 = uVar5 + 2) {
    *(undefined8 *)(SK + uVar5) = *(undefined8 *)puVar2;
    puVar2 = puVar2 + -2;
  }
  textsz = 0;
  pcVar3 = luaL_checklstring(L,2,&textsz);
  if (textsz == 0 || (textsz & 7) != 0) {
    iVar1 = luaL_error(L,"Invalid des crypt text length %d");
  }
  else {
    if (textsz < 0x101) {
      s = tmp;
    }
    else {
      s = (uint8_t *)lua_newuserdata(L,textsz);
    }
    for (uVar5 = 0; uVar5 < textsz; uVar5 = uVar5 + 8) {
      des_crypt(SK,(uint8_t *)(pcVar3 + uVar5),s + uVar5);
    }
    iVar1 = (int)textsz;
    lVar4 = 1;
    while( true ) {
      iVar1 = iVar1 + -1;
      if ((ulong)(long)iVar1 < textsz - 8) break;
      if (s[iVar1] != '\0') {
        if (s[iVar1] != 0x80) goto LAB_0011a231;
        break;
      }
      lVar4 = lVar4 + 1;
    }
    if ((uint)lVar4 < 9) {
      lua_pushlstring(L,(char *)s,textsz - lVar4);
      iVar1 = 1;
    }
    else {
LAB_0011a231:
      iVar1 = luaL_error(L,"Invalid des crypt text");
    }
  }
  return iVar1;
}

Assistant:

static int
ldesdecode(lua_State *L) {
	uint32_t ESK[32];
	des_key(L, ESK);
	uint32_t SK[32];
	int i;
	for( i = 0; i < 32; i += 2 ) {
		SK[i] = ESK[30 - i];
		SK[i + 1] = ESK[31 - i];
	}
	size_t textsz = 0;
	const uint8_t *text = (const uint8_t *)luaL_checklstring(L, 2, &textsz);
	if ((textsz & 7) || textsz == 0) {
		return luaL_error(L, "Invalid des crypt text length %d", (int)textsz);
	}
	uint8_t tmp[SMALL_CHUNK];
	uint8_t *buffer = tmp;
	if (textsz > SMALL_CHUNK) {
		buffer = lua_newuserdata(L, textsz);
	}
	for (i=0;i<textsz;i+=8) {
		des_crypt(SK, text+i, buffer+i);
	}
	int padding = 1;
	for (i=textsz-1;i>=textsz-8;i--) {
		if (buffer[i] == 0) {
			padding++;
		} else if (buffer[i] == 0x80) {
			break;
		} else {
			return luaL_error(L, "Invalid des crypt text");
		}
	}
	if (padding > 8) {
		return luaL_error(L, "Invalid des crypt text");
	}
	lua_pushlstring(L, (const char *)buffer, textsz - padding);
	return 1;
}